

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O1

bool32 __thiscall rw::AnimInterpolator::setCurrentAnim(AnimInterpolator *this,Animation *anim)

{
  AnimInterpolatorInfo *pAVar1;
  int iVar2;
  bool32 bVar3;
  void *pvVar4;
  int iVar5;
  Animation *pAVar6;
  long lVar7;
  
  pAVar1 = anim->interpInfo;
  this->currentAnim = anim;
  this->currentTime = 0.0;
  if (this->maxInterpKeyFrameSize + 0x10 < pAVar1->interpKeyFrameSize) {
    setCurrentAnim();
    bVar3 = 0;
  }
  else {
    this->currentInterpKeyFrameSize = pAVar1->interpKeyFrameSize;
    this->currentAnimKeyFrameSize = pAVar1->animKeyFrameSize;
    this->applyCB = pAVar1->applyCB;
    this->blendCB = pAVar1->blendCB;
    this->interpCB = pAVar1->interpCB;
    this->addCB = pAVar1->addCB;
    iVar2 = this->numNodes;
    if (0 < iVar2) {
      iVar5 = 0;
      do {
        lVar7 = (long)iVar5 * (long)this->currentInterpKeyFrameSize;
        pvVar4 = this->currentAnim->keyframes;
        pAVar6 = (Animation *)((long)(this->currentAnimKeyFrameSize * iVar5) + (long)pvVar4);
        pvVar4 = (void *)((long)((iVar2 + iVar5) * this->currentAnimKeyFrameSize) + (long)pvVar4);
        *(Animation **)((long)&this[1].currentAnim + lVar7) = pAVar6;
        *(void **)((long)&this[1].currentTime + lVar7) = pvVar4;
        if (this->interpCB != (InterpCB)0x0) {
          (*this->interpCB)((Animation **)((long)&this[1].currentAnim + lVar7),pAVar6,pvVar4,0.0,
                            anim->customData);
        }
        iVar5 = iVar5 + 1;
        iVar2 = this->numNodes;
      } while (iVar5 < iVar2);
    }
    this->nextFrame =
         (void *)((long)this->currentAnimKeyFrameSize * (long)iVar2 * 2 +
                 (long)this->currentAnim->keyframes);
    bVar3 = 1;
  }
  return bVar3;
}

Assistant:

bool32
AnimInterpolator::setCurrentAnim(Animation *anim)
{
	int32 i;
	AnimInterpolatorInfo *interpInfo = anim->interpInfo;
	this->currentAnim = anim;
	this->currentTime = 0.0f;
	int32 maxkf = this->maxInterpKeyFrameSize;
	if(sizeof(void*) > 4)	// see above in create()
		maxkf += 16;
	if(interpInfo->interpKeyFrameSize > maxkf){
		RWERROR((ERR_GENERAL, "interpolation frame too big"));
		return 0;
	}
	this->currentInterpKeyFrameSize = interpInfo->interpKeyFrameSize;
	this->currentAnimKeyFrameSize = interpInfo->animKeyFrameSize;
	this->applyCB = interpInfo->applyCB;
	this->blendCB = interpInfo->blendCB;
	this->interpCB = interpInfo->interpCB;
	this->addCB = interpInfo->addCB;
	for(i = 0; i < numNodes; i++){
		InterpFrameHeader *intf;
		KeyFrameHeader *kf1, *kf2;
		intf = this->getInterpFrame(i);
		kf1 = this->getAnimFrame(i);
		kf2 = this->getAnimFrame(i+numNodes);
		intf->keyFrame1 = kf1;
		intf->keyFrame2 = kf2;
		// TODO: perhaps just implement all interpolator infos?
		if(this->interpCB)
			this->interpCB(intf, kf1, kf2, 0.0f, anim->customData);
	}
	this->nextFrame = this->getAnimFrame(numNodes*2);
	return 1;
}